

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
::try_emplace<int>(btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   *this,const_iterator hint,key_type *k,int *args)

{
  iterator iVar1;
  iterator position;
  tuple<int_&&> local_30;
  tuple<int_&&> local_28;
  undefined1 local_20 [2] [12];
  
  position._8_8_ = hint._8_8_ & 0xffffffff;
  position.node = hint.node;
  local_30.super__Tuple_impl<0UL,_int_&&>.super__Head_base<0UL,_int_&&,_false>._M_head_impl =
       (_Tuple_impl<0UL,_int_&&>)(_Tuple_impl<0UL,_int_&&>)args;
  local_28.super__Tuple_impl<0UL,_int_&&>.super__Head_base<0UL,_int_&&,_false>._M_head_impl =
       (_Tuple_impl<0UL,_int_&&>)(_Tuple_impl<0UL,_int_&&>)k;
  btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
  ::insert_hint_unique<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
            ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
              *)local_20,
             (btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
              *)this,position,k,(piecewise_construct_t *)&std::piecewise_construct,&local_28,
             &local_30);
  iVar1._12_4_ = 0;
  iVar1.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                *)local_20[0]._0_8_;
  iVar1.position = local_20[0]._8_4_;
  return iVar1;
}

Assistant:

iterator try_emplace(const_iterator hint, key_type &&k, Args &&... args) {
            // Note: `key_ref` exists to avoid a ClangTidy warning about moving from `k`
            // and then using `k` unsequenced. This is safe because the move is into a
            // forwarding reference and insert_hint_unique guarantees that `key` is
            // never referenced after consuming `args`.
            const key_type& key_ref = k;
            return this->tree_
                .insert_hint_unique(iterator(hint), key_ref, std::piecewise_construct,
                                    std::forward_as_tuple(std::move(k)),
                                    std::forward_as_tuple(std::forward<Args>(args)...))
                .first;
        }